

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Result RVar6;
  TargetType TVar7;
  size_type sVar8;
  const_reference pvVar9;
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  string *psVar10;
  ostream *poVar11;
  ulong uVar12;
  size_t sVar13;
  char *pcVar14;
  basic_string_view<char,_std::char_traits<char>_> __y;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar15;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  char *local_940;
  char *local_918;
  char *local_8f0;
  char *local_8c8;
  char *local_8a0;
  char *local_878;
  cmGeneratorTarget *local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  undefined1 local_6aa;
  allocator<char> local_6a9;
  char *local_6a8;
  char *propContent_4;
  char *local_698;
  char *propContent_3;
  char *local_688;
  char *propContent_2;
  char *local_678;
  char *propContent_1;
  char *local_668;
  char *propContent;
  string local_658;
  cmLinkImplementationLibraries *local_638;
  cmLinkImplementationLibraries *impl;
  cmLinkInterfaceLibraries *local_610;
  cmLinkInterfaceLibraries *iface;
  cmGeneratorTarget *headTarget;
  PolicyStatus polSt;
  bool isInterfaceProperty;
  string interfacePropertyName;
  string linkedTargetsContent;
  string local_5b0;
  string local_590;
  char *local_570;
  char *p;
  undefined1 local_560 [7];
  bool haveProp;
  string prop;
  size_t i;
  string local_518;
  cmListFileBacktrace local_4f8;
  undefined1 local_4e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0;
  _Base_ptr local_390;
  undefined1 local_388;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  _Base_ptr local_2f0;
  undefined1 local_2e8;
  _Base_ptr local_2e0;
  undefined1 local_2d8;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [8];
  ostringstream e_1;
  cmGeneratorTarget *tgt;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  char *local_98;
  char *e;
  string propertyName;
  string targetName;
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetPropertyNode *this_local;
  string *result;
  
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar5 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  targetName.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(propertyName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&e);
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(parameters);
  if (sVar8 == 2) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,0);
    std::__cxx11::string::operator=
              ((string *)(propertyName.field_2._M_local_buf + 8),(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,1);
    std::__cxx11::string::operator=((string *)&e,(string *)pvVar9);
    local_98 = GetErrorText((string *)((long)&propertyName.field_2 + 8),(string *)&e);
    if (local_98 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
      pcVar14 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar14,&local_d9);
      reportError(context,&local_b8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      goto LAB_005e31a0;
    }
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
    __y = (basic_string_view<char,_std::char_traits<char>_>)
          ::cm::operator____s("ALIASED_TARGET",0xe);
    bVar2 = std::operator==(__x,__y);
    if (bVar2) {
      this_00 = cmLocalGenerator::GetMakefile(context->LG);
      bVar2 = cmMakefile::IsAlias(this_00,(string *)((long)&propertyName.field_2 + 8));
      if ((bVar2) &&
         (this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                              (context->LG,(string *)((long)&propertyName.field_2 + 8)),
         this_01 != (cmGeneratorTarget *)0x0)) {
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar10);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      goto LAB_005e31a0;
    }
    targetName.field_2._8_8_ =
         cmLocalGenerator::FindGeneratorTargetToUse
                   (context->LG,(string *)((long)&propertyName.field_2 + 8));
    if ((cmGeneratorTarget *)targetName.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
      poVar11 = std::operator<<((ostream *)local_290,"Target \"");
      poVar11 = std::operator<<(poVar11,(string *)(propertyName.field_2._M_local_buf + 8));
      std::operator<<(poVar11,"\" not found.");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_2b0,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_2b0,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
      goto LAB_005e31a0;
    }
    pVar15 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&context->AllTargets,(value_type *)((long)&targetName.field_2 + 8));
    local_2e0 = (_Base_ptr)pVar15.first._M_node;
    local_2d8 = pVar15.second;
  }
  else {
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(parameters);
    if (sVar8 != 1) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_358,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,
                 "$<TARGET_PROPERTY:...> expression requires one or two parameters",&local_379);
      reportError(context,&local_358,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      goto LAB_005e31a0;
    }
    targetName.field_2._8_8_ = context->HeadTarget;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,0);
    std::__cxx11::string::operator=((string *)&e,(string *)pvVar9);
    pVar16 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&context->SeenTargetProperties,(value_type *)&e);
    local_2f0 = (_Base_ptr)pVar16.first._M_node;
    local_2e8 = pVar16.second;
    context->HadHeadSensitiveCondition = true;
    if (targetName.field_2._8_8_ == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_310,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,&local_331);
      reportError(context,&local_310,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      goto LAB_005e31a0;
    }
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "SOURCES");
  if (bVar2) {
    pVar15 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&context->SourceSensitiveTargets,(value_type *)((long)&targetName.field_2 + 8)
                     );
    local_390 = (_Base_ptr)pVar15.first._M_node;
    local_388 = pVar15.second;
  }
  uVar12 = std::__cxx11::string::empty();
  if ((uVar12 & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3b0,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,
               "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",&local_3d1);
    reportError(context,&local_3b0,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    goto LAB_005e31a0;
  }
  bVar2 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,(string *)&e);
  if (!bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3f8,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"Property name not supported.",&local_419);
    reportError(context,&local_3f8,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    goto LAB_005e31a0;
  }
  if (targetName.field_2._8_8_ == 0) {
    __assert_fail("target",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                  ,0x4a9,
                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                 );
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "LINKER_LANGUAGE");
  if (bVar2) {
    bVar2 = cmGeneratorTarget::LinkLanguagePropagatesToDependents
                      ((cmGeneratorTarget *)targetName.field_2._8_8_);
    if (((bVar2) && (dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0)) &&
       ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                           (dagCheckerParent,(cmGeneratorTarget *)0x0), bVar2 ||
        (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), bVar2)))) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_440,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,
                 "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                 ,(allocator<char> *)&dagChecker.field_0x7f);
      reportError(context,&local_440,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator((allocator<char> *)&dagChecker.field_0x7f);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      cmGeneratorTarget::GetLinkerLanguage
                (__return_storage_ptr__,(cmGeneratorTarget *)targetName.field_2._8_8_,
                 &context->Config);
    }
    goto LAB_005e31a0;
  }
  cmListFileBacktrace::cmListFileBacktrace(&local_4f8,&context->Backtrace);
  uVar1 = targetName.field_2._8_8_;
  std::__cxx11::string::string((string *)&local_518,(string *)&e);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_4e8,&local_4f8,(cmGeneratorTarget *)uVar1,
             &local_518,content,dagCheckerParent);
  std::__cxx11::string::~string((string *)&local_518);
  cmListFileBacktrace::~cmListFileBacktrace(&local_4f8);
  RVar6 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_4e8);
  switch(RVar6) {
  case SELF_REFERENCE:
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&i,content);
    cmGeneratorExpressionDAGChecker::ReportError
              ((cmGeneratorExpressionDAGChecker *)local_4e8,context,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    break;
  case CYCLIC_REFERENCE:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    break;
  case ALREADY_SEEN:
    for (prop.field_2._8_8_ = 1; uVar1 = prop.field_2._8_8_,
        sVar13 = std::size<char_const*,11ul>(&targetPropertyTransitiveWhitelist),
        (ulong)uVar1 < sVar13; prop.field_2._8_8_ = prop.field_2._8_8_ + 1) {
      bVar2 = std::operator==(targetPropertyTransitiveWhitelist[prop.field_2._8_8_],
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e);
      if (bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        goto LAB_005e3184;
      }
    }
  case DAG:
  default:
    std::__cxx11::string::string((string *)local_560);
    p._7_1_ = 0;
    local_570 = cmGeneratorTarget::GetProperty
                          ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e);
    if (local_570 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)local_560,local_570);
      p._7_1_ = 1;
    }
    if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
        (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(dagCheckerParent), bVar2
        )) || (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent),
              bVar2)) {
LAB_005e2234:
      std::__cxx11::string::string((string *)(interfacePropertyName.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&polSt);
      headTarget._7_1_ = 0;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e,"INCLUDE_DIRECTORIES");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_INCLUDE_DIRECTORIES");
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&e,"INTERFACE_INCLUDE_DIRECTORIES");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_INCLUDE_DIRECTORIES");
          headTarget._7_1_ = 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&e,"SYSTEM_INCLUDE_DIRECTORIES");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")
            ;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
            if (bVar2) {
              std::__cxx11::string::operator=
                        ((string *)&polSt,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
              headTarget._7_1_ = 1;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e,"COMPILE_DEFINITIONS");
              if (bVar2) {
                std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_DEFINITIONS");
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&e,"INTERFACE_COMPILE_DEFINITIONS");
                if (bVar2) {
                  std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_DEFINITIONS");
                  headTarget._7_1_ = 1;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&e,"COMPILE_OPTIONS");
                  if (bVar2) {
                    std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_OPTIONS");
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&e,"INTERFACE_COMPILE_OPTIONS");
                    if (bVar2) {
                      std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_OPTIONS");
                      headTarget._7_1_ = 1;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&e,"AUTOUIC_OPTIONS");
                      if (bVar2) {
                        std::__cxx11::string::operator=
                                  ((string *)&polSt,"INTERFACE_AUTOUIC_OPTIONS");
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&e,"INTERFACE_AUTOUIC_OPTIONS");
                        if (bVar2) {
                          std::__cxx11::string::operator=
                                    ((string *)&polSt,"INTERFACE_AUTOUIC_OPTIONS");
                          headTarget._7_1_ = 1;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"SOURCES");
                          if (bVar2) {
                            std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SOURCES");
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_SOURCES");
                            if (bVar2) {
                              std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SOURCES");
                              headTarget._7_1_ = 1;
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"COMPILE_FEATURES");
                              if (bVar2) {
                                std::__cxx11::string::operator=
                                          ((string *)&polSt,"INTERFACE_COMPILE_FEATURES");
                              }
                              else {
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_COMPILE_FEATURES");
                                if (bVar2) {
                                  std::__cxx11::string::operator=
                                            ((string *)&polSt,"INTERFACE_COMPILE_FEATURES");
                                  headTarget._7_1_ = 1;
                                }
                                else {
                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_OPTIONS");
                                  if (bVar2) {
                                    std::__cxx11::string::operator=
                                              ((string *)&polSt,"INTERFACE_LINK_OPTIONS");
                                  }
                                  else {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_OPTIONS");
                                    if (bVar2) {
                                      std::__cxx11::string::operator=
                                                ((string *)&polSt,"INTERFACE_LINK_OPTIONS");
                                      headTarget._7_1_ = 1;
                                    }
                                    else {
                                      bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_DIRECTORIES");
                                      if (bVar2) {
                                        std::__cxx11::string::operator=
                                                  ((string *)&polSt,"INTERFACE_LINK_DIRECTORIES");
                                      }
                                      else {
                                        bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_DIRECTORIES");
                                        if (bVar2) {
                                          std::__cxx11::string::operator=
                                                    ((string *)&polSt,"INTERFACE_LINK_DIRECTORIES");
                                          headTarget._7_1_ = 1;
                                        }
                                        else {
                                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_DEPENDS");
                                          if (bVar2) {
                                            std::__cxx11::string::operator=
                                                      ((string *)&polSt,"INTERFACE_LINK_DEPENDS");
                                          }
                                          else {
                                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_DEPENDS");
                                            if (bVar2) {
                                              std::__cxx11::string::operator=
                                                        ((string *)&polSt,"INTERFACE_LINK_DEPENDS");
                                              headTarget._7_1_ = 1;
                                            }
                                            else {
                                              bVar2 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                                                                ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,(char (*) [21])"COMPILE_DEFINITIONS_");
                                              if ((bVar2) &&
                                                 ((headTarget._0_4_ =
                                                        cmLocalGenerator::GetPolicyStatus
                                                                  (context->LG,CMP0043),
                                                  (PolicyStatus)headTarget == WARN ||
                                                  ((PolicyStatus)headTarget == OLD)))) {
                                                std::__cxx11::string::operator=
                                                          ((string *)&polSt,
                                                           "INTERFACE_COMPILE_DEFINITIONS");
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((context->HeadTarget == (cmGeneratorTarget *)0x0) || ((headTarget._7_1_ & 1) == 0)) {
        local_850 = (cmGeneratorTarget *)targetName.field_2._8_8_;
      }
      else {
        local_850 = context->HeadTarget;
      }
      iface = (cmLinkInterfaceLibraries *)local_850;
      if ((headTarget._7_1_ & 1) == 0) {
        uVar12 = std::__cxx11::string::empty();
        if (((uVar12 & 1) == 0) &&
           (local_638 = cmGeneratorTarget::GetLinkImplementationLibraries
                                  ((cmGeneratorTarget *)targetName.field_2._8_8_,&context->Config),
           local_638 != (cmLinkImplementationLibraries *)0x0)) {
          getLinkedTargetsContent<cmLinkImplItem>
                    (&local_658,&local_638->Libraries,(cmGeneratorTarget *)targetName.field_2._8_8_,
                     (cmGeneratorTarget *)targetName.field_2._8_8_,context,
                     (cmGeneratorExpressionDAGChecker *)local_4e8,(string *)&polSt);
          std::__cxx11::string::operator=
                    ((string *)(interfacePropertyName.field_2._M_local_buf + 8),(string *)&local_658
                    );
          std::__cxx11::string::~string((string *)&local_658);
        }
      }
      else {
        local_610 = cmGeneratorTarget::GetLinkInterfaceLibraries
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,&context->Config,
                               local_850,true);
        if (local_610 != (cmLinkInterfaceLibraries *)0x0) {
          getLinkedTargetsContent<cmLinkItem>
                    ((string *)&impl,&local_610->Libraries,
                     (cmGeneratorTarget *)targetName.field_2._8_8_,(cmGeneratorTarget *)iface,
                     context,(cmGeneratorExpressionDAGChecker *)local_4e8,(string *)&polSt);
          std::__cxx11::string::operator=
                    ((string *)(interfacePropertyName.field_2._M_local_buf + 8),(string *)&impl);
          std::__cxx11::string::~string((string *)&impl);
        }
      }
      if ((p._7_1_ & 1) == 0) {
        bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)targetName.field_2._8_8_);
        if ((bVar2) ||
           (TVar7 = cmGeneratorTarget::GetType((cmGeneratorTarget *)targetName.field_2._8_8_),
           TVar7 == INTERFACE_LIBRARY)) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,
                     (string *)(interfacePropertyName.field_2._M_local_buf + 8));
        }
        else {
          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                            ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                             &context->Config);
          if (bVar2) {
            context->HadContextSensitiveCondition = true;
            bVar2 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (bVar2) {
              local_878 = "1";
            }
            else {
              local_878 = "0";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,local_878,
                       (allocator<char> *)((long)&propContent + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&propContent + 7));
          }
          else {
            bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (bVar2) {
              context->HadContextSensitiveCondition = true;
              local_668 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                    ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                     &context->Config);
              local_8a0 = local_668;
              if (local_668 == (char *)0x0) {
                local_8a0 = "";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,local_8a0,
                         (allocator<char> *)((long)&propContent_1 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_1 + 7));
            }
            else {
              bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                 &context->Config);
              if (bVar2) {
                context->HadContextSensitiveCondition = true;
                local_678 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                       &context->Config);
                local_8c8 = local_678;
                if (local_678 == (char *)0x0) {
                  local_8c8 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,local_8c8,
                           (allocator<char> *)((long)&propContent_2 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_2 + 7));
              }
              else {
                bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                  ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                   &context->Config);
                if (bVar2) {
                  context->HadContextSensitiveCondition = true;
                  local_688 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                        ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                         &context->Config);
                  local_8f0 = local_688;
                  if (local_688 == (char *)0x0) {
                    local_8f0 = "";
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,local_8f0,
                             (allocator<char> *)((long)&propContent_3 + 7));
                  std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_3 + 7));
                }
                else {
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,
                             (string *)(interfacePropertyName.field_2._M_local_buf + 8));
                }
              }
            }
          }
        }
      }
      else {
        bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)targetName.field_2._8_8_);
        if (((bVar2) || (dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0)) ||
           (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                              (dagCheckerParent,(cmGeneratorTarget *)0x0), bVar2)) {
LAB_005e2ff8:
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            local_6aa = 0;
            cmGeneratorExpressionNode::EvaluateDependentExpression
                      (__return_storage_ptr__,(string *)local_560,context->LG,context,
                       (cmGeneratorTarget *)iface,(cmGeneratorTarget *)targetName.field_2._8_8_,
                       (cmGeneratorExpressionDAGChecker *)local_4e8);
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              cVar4 = std::__cxx11::string::empty();
              pcVar14 = ";";
              if (cVar4 != '\0') {
                pcVar14 = "";
              }
              std::operator+(&local_6d0,pcVar14,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&interfacePropertyName.field_2 + 8));
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_6d0);
              std::__cxx11::string::~string((string *)&local_6d0);
            }
            local_6aa = 1;
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_560);
          }
        }
        else {
          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                            ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                             &context->Config);
          if (bVar2) {
            context->HadContextSensitiveCondition = true;
            local_698 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                  ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                   &context->Config);
            local_918 = local_698;
            if (local_698 == (char *)0x0) {
              local_918 = "";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,local_918,
                       (allocator<char> *)((long)&propContent_4 + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_4 + 7));
          }
          else {
            bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (!bVar2) goto LAB_005e2ff8;
            context->HadContextSensitiveCondition = true;
            local_6a8 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                  ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                   &context->Config);
            local_940 = local_6a8;
            if (local_6a8 == (char *)0x0) {
              local_940 = "";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,local_940,&local_6a9);
            std::allocator<char>::~allocator(&local_6a9);
          }
        }
      }
      std::__cxx11::string::~string((string *)&polSt);
      std::__cxx11::string::~string((string *)(interfacePropertyName.field_2._M_local_buf + 8));
    }
    else {
      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagCheckerParent,(cmGeneratorTarget *)0x0);
      if (!bVar2) {
        bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(dagCheckerParent);
        bVar2 = true;
        if (!bVar3) {
          bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                            (dagCheckerParent);
          bVar2 = true;
          if (!bVar3) {
            bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(dagCheckerParent);
            bVar2 = true;
            if (!bVar3) {
              bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(dagCheckerParent);
              bVar2 = true;
              if (!bVar3) {
                bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions(dagCheckerParent);
                bVar2 = true;
                if (!bVar3) {
                  bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent);
                  bVar2 = true;
                  if (!bVar3) {
                    bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                      (dagCheckerParent);
                    bVar2 = true;
                    if (!bVar3) {
                      bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                        (dagCheckerParent);
                      bVar2 = true;
                      if (!bVar3) {
                        bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                          (dagCheckerParent);
                        bVar2 = true;
                        if (!bVar3) {
                          bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                            (dagCheckerParent);
                          bVar2 = true;
                          if (!bVar3) {
                            bVar2 = false;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (!bVar2) {
          __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                        ,0x4ee,
                        "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        goto LAB_005e2234;
      }
      bVar2 = std::operator==("INCLUDE_DIRECTORIES",
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e);
      if ((((bVar2) ||
           (bVar2 = std::operator==("INTERFACE_INCLUDE_DIRECTORIES",
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e), bVar2)) ||
          (((bVar2 = std::operator==("SYSTEM_INCLUDE_DIRECTORIES",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&e), bVar2 ||
            ((bVar2 = std::operator==("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e), bVar2 ||
             (bVar2 = std::operator==("COMPILE_DEFINITIONS",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e), bVar2)))) ||
           (bVar2 = std::operator==("INTERFACE_COMPILE_DEFINITIONS",
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e), bVar2)))) ||
         ((((((bVar2 = std::operator==("COMPILE_OPTIONS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&e), bVar2 ||
              (bVar2 = std::operator==("INTERFACE_COMPILE_OPTIONS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&e), bVar2)) ||
             (bVar2 = std::operator==("AUTOUIC_OPTIONS",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e), bVar2)) ||
            (((bVar2 = std::operator==("INTERFACE_AUTOUIC_OPTIONS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&e), bVar2 ||
              (bVar2 = std::operator==("SOURCES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&e), bVar2)) ||
             ((bVar2 = std::operator==("INTERFACE_SOURCES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&e), bVar2 ||
              ((bVar2 = std::operator==("COMPILE_FEATURES",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&e), bVar2 ||
               (bVar2 = std::operator==("INTERFACE_COMPILE_FEATURES",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&e), bVar2)))))))) ||
           (bVar2 = std::operator==("LINK_OPTIONS",
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e), bVar2)) ||
          ((((bVar2 = std::operator==("INTERFACE_LINK_OPTIONS",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e), bVar2 ||
             (bVar2 = std::operator==("LINK_DIRECTORIES",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e), bVar2)) ||
            (bVar2 = std::operator==("INTERFACE_LINK_DIRECTORIES",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&e), bVar2)) ||
           ((bVar2 = std::operator==("LINK_DEPENDS",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&e), bVar2 ||
            (bVar2 = std::operator==("INTERFACE_LINK_DEPENDS",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&e), bVar2)))))))) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_590,content);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b0,
                   "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                   ,(allocator<char> *)(linkedTargetsContent.field_2._M_local_buf + 0xf));
        reportError(context,&local_590,&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(linkedTargetsContent.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        if ((p._7_1_ & 1) != 0) goto LAB_005e2234;
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::~string((string *)local_560);
  }
LAB_005e3184:
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_4e8);
LAB_005e31a0:
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)(propertyName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName, propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string prop;
    bool haveProp = false;
    if (const char* p = target->GetProperty(propertyName)) {
      prop = p;
      haveProp = true;
    }

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!haveProp) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!haveProp) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }